

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::RunContext
          (RunContext *this,Ptr<const_Catch::IConfig> *_config,
          Ptr<Catch::IStreamingReporter> *reporter)

{
  IConfig *pIVar1;
  IStreamingReporter *pIVar2;
  IMutableContext *pIVar3;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_00163b58;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&DAT_00163bd0;
  (*(_config->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_50);
  (this->m_runInfo).name._M_dataplus._M_p = (pointer)&(this->m_runInfo).name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&this->m_runInfo,local_50,local_50 + local_48)
  ;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  pIVar3 = getCurrentMutableContext();
  this->m_context = pIVar3;
  this->m_activeTestCase = (TestCase *)0x0;
  (this->m_lastResult).m_info.macroName._M_dataplus._M_p =
       (pointer)&(this->m_lastResult).m_info.macroName.field_2;
  (this->m_lastResult).m_info.macroName._M_string_length = 0;
  (this->m_lastResult).m_info.macroName.field_2._M_local_buf[0] = '\0';
  (this->m_lastResult).m_info.lineInfo.file = "";
  (this->m_lastResult).m_info.lineInfo.line = 0;
  (this->m_lastResult).m_info.capturedExpression._M_dataplus._M_p =
       (pointer)&(this->m_lastResult).m_info.capturedExpression.field_2;
  (this->m_lastResult).m_info.capturedExpression._M_string_length = 0;
  (this->m_lastResult).m_info.capturedExpression.field_2._M_local_buf[0] = '\0';
  (this->m_lastResult).m_resultData.decomposedExpression = (DecomposedExpression *)0x0;
  (this->m_lastResult).m_resultData.reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_lastResult).m_resultData.reconstructedExpression.field_2;
  (this->m_lastResult).m_resultData.reconstructedExpression._M_string_length = 0;
  (this->m_lastResult).m_resultData.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  (this->m_lastResult).m_resultData.message._M_dataplus._M_p =
       (pointer)&(this->m_lastResult).m_resultData.message.field_2;
  (this->m_lastResult).m_resultData.message._M_string_length = 0;
  (this->m_lastResult).m_resultData.message.field_2._M_local_buf[0] = '\0';
  (this->m_lastResult).m_resultData.resultType = Unknown;
  (this->m_lastResult).m_resultData.negated = false;
  (this->m_lastResult).m_resultData.parenthesized = false;
  pIVar1 = _config->m_p;
  (this->m_config).m_p = pIVar1;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  (this->m_totals).testCases.failed = 0;
  (this->m_totals).testCases.failedButOk = 0;
  (this->m_totals).assertions.failedButOk = 0;
  (this->m_totals).testCases.passed = 0;
  (this->m_totals).assertions.passed = 0;
  (this->m_totals).assertions.failed = 0;
  pIVar2 = reporter->m_p;
  (this->m_reporter).m_p = pIVar2;
  if (pIVar2 != (IStreamingReporter *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_lastAssertionInfo).macroName._M_dataplus._M_p =
       (pointer)&(this->m_lastAssertionInfo).macroName.field_2;
  (this->m_lastAssertionInfo).macroName._M_string_length = 0;
  (this->m_lastAssertionInfo).macroName.field_2._M_local_buf[0] = '\0';
  (this->m_lastAssertionInfo).lineInfo.file = "";
  (this->m_lastAssertionInfo).lineInfo.line = 0;
  (this->m_lastAssertionInfo).capturedExpression._M_dataplus._M_p =
       (pointer)&(this->m_lastAssertionInfo).capturedExpression.field_2;
  (this->m_lastAssertionInfo).capturedExpression._M_string_length = 0;
  (this->m_lastAssertionInfo).capturedExpression.field_2._M_local_buf[0] = '\0';
  (this->m_unfinishedSections).
  super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unfinishedSections).
  super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unfinishedSections).
  super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_activeSections).
  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_activeSections).
  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_activeSections).
  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_trackerContext).m_rootTracker.m_p = (ITracker *)0x0;
  (this->m_trackerContext).m_currentTracker = (ITracker *)0x0;
  (this->m_trackerContext).m_runState = NotStarted;
  this->m_shouldReportUnexpected = true;
  (*(this->m_context->super_IContext)._vptr_IContext[8])(this->m_context,&this->super_IRunner);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,&this->m_config);
  (*(this->m_context->super_IContext)._vptr_IContext[7])(this->m_context,this);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(pIVar2,&this->m_runInfo);
  return;
}

Assistant:

explicit RunContext( Ptr<IConfig const> const& _config, Ptr<IStreamingReporter> const& reporter )
        :   m_runInfo( _config->name() ),
            m_context( getCurrentMutableContext() ),
            m_activeTestCase( CATCH_NULL ),
            m_config( _config ),
            m_reporter( reporter ),
            m_shouldReportUnexpected ( true )
        {
            m_context.setRunner( this );
            m_context.setConfig( m_config );
            m_context.setResultCapture( this );
            m_reporter->testRunStarting( m_runInfo );
        }